

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdg-datastore.cc
# Opt level: O1

uint32_t detect_read_size(string *read_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  uint uVar4;
  uint *__s;
  long lVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  uint *puVar6;
  value_type_conflict3 *__val;
  uint32_t i;
  ulong uVar7;
  FastqRecord rec;
  FastqReader<FastqRecord> fastqReader;
  FastqRecord local_190;
  FastqReader<FastqRecord> local_108;
  
  __s = (uint *)operator_new(400);
  memset(__s,0,400);
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  local_190.name._M_string_length = 0;
  local_190.name.field_2._M_local_buf[0] = '\0';
  local_190.comment._M_dataplus._M_p = (pointer)&local_190.comment.field_2;
  local_190.comment._M_string_length = 0;
  local_190.comment.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_190.seq.field_2;
  local_190.seq._M_string_length = 0;
  local_190.seq.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_190.qual.field_2;
  local_190.qual._M_string_length = 0;
  local_190.qual.field_2._M_local_buf[0] = '\0';
  local_190.seq._M_dataplus._M_p = (pointer)paVar1;
  local_190.qual._M_dataplus._M_p = (pointer)paVar2;
  FastqReader<FastqRecord>::FastqReader(&local_108,(FastxReaderParams)0x0,read_filename);
  uVar7 = 0;
  while( true ) {
    bVar3 = FastqReader<FastqRecord>::next_record(&local_108,&local_190);
    if (!bVar3 || 99 < uVar7) break;
    __s[uVar7] = (uint)local_190.seq._M_string_length;
    uVar7 = uVar7 + 1;
  }
  uVar7 = 100;
  do {
    bVar3 = FastqReader<FastqRecord>::next_record(&local_108,&local_190);
    if (!bVar3) break;
    uVar4 = rand();
    if ((uint)((ulong)uVar4 % uVar7) < 100) {
      __s[(ulong)uVar4 % uVar7] = (uint)local_190.seq._M_string_length;
    }
    uVar4 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar4;
  } while (uVar4 != 10000);
  lVar5 = 4;
  puVar6 = __s;
  do {
    if (*puVar6 < *(uint *)((long)__s + lVar5)) {
      puVar6 = (uint *)((long)__s + lVar5);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 400);
  uVar4 = *puVar6;
  FastqReader<FastqRecord>::~FastqReader(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.qual._M_dataplus._M_p != paVar2) {
    operator_delete(local_190.qual._M_dataplus._M_p,
                    CONCAT71(local_190.qual.field_2._M_allocated_capacity._1_7_,
                             local_190.qual.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.seq._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.seq._M_dataplus._M_p,
                    CONCAT71(local_190.seq.field_2._M_allocated_capacity._1_7_,
                             local_190.seq.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.comment._M_dataplus._M_p != &local_190.comment.field_2) {
    operator_delete(local_190.comment._M_dataplus._M_p,
                    CONCAT71(local_190.comment.field_2._M_allocated_capacity._1_7_,
                             local_190.comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,
                    CONCAT71(local_190.name.field_2._M_allocated_capacity._1_7_,
                             local_190.name.field_2._M_local_buf[0]) + 1);
  }
  operator_delete(__s,400);
  return uVar4;
}

Assistant:

uint32_t detect_read_size(const std::string &read_filename) {
    std::vector<uint32_t> read_sizes(100);

    FastqRecord rec;
    FastqReader<FastqRecord> fastqReader({}, read_filename);
    uint32_t i = 0;
    while(fastqReader.next_record(rec) and i < read_sizes.size()) {
        read_sizes[i++] = rec.seq.size();
    }
    for (uint32_t i = 100; i < 10000 and fastqReader.next_record(rec); i++) {
        uint32_t j = std::rand()%i;
        if (j < 100) {
            read_sizes[j] = rec.seq.size();
        }
    }
    return (*std::max_element(read_sizes.begin(), read_sizes.end()));
}